

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkServerTest.cpp
# Opt level: O0

bool __thiscall MyServer::Initialize(MyServer *this)

{
  bool bVar1;
  byte bVar2;
  LogStringBuffer *in_RDI;
  SDKJsonResult result;
  LogStringBuffer buffer;
  undefined7 in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffc8f;
  LogStringBuffer *in_stack_fffffffffffffc90;
  OutputWorker *this_00;
  __pthread_internal_list local_320 [3];
  undefined1 local_2f0 [64];
  Channel *local_2b0;
  undefined8 local_2a8;
  char *local_2a0;
  undefined4 local_294;
  Channel *local_290;
  undefined4 local_284;
  Channel *local_280;
  undefined1 local_268 [16];
  ostream aoStack_258 [376];
  __pthread_internal_list *local_e0;
  char *local_d8;
  undefined4 local_cc;
  Channel *local_c8;
  __pthread_internal_list *local_c0;
  char *local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  Channel *local_a0;
  undefined8 local_98;
  undefined1 *local_90;
  Channel *local_88;
  undefined8 local_80;
  undefined1 *local_78;
  __pthread_internal_list *local_70;
  char *local_68;
  undefined1 *local_60;
  Channel *local_58;
  char *local_50;
  undefined1 *local_48;
  Channel *local_40;
  char *local_38;
  undefined1 *local_30;
  __pthread_internal_list *local_28;
  undefined1 *local_20;
  Channel *local_18;
  __pthread_internal_list *local_10;
  undefined1 *local_8;
  
  *(undefined4 *)&in_RDI->field_0x24 = 0x13c4;
  *(undefined4 *)&in_RDI->field_0x28 = 10;
  *(undefined4 *)&in_RDI->field_0x54 = 2;
  in_RDI->field_0x54 = in_RDI->field_0x54 | 4;
  *(undefined4 *)&in_RDI->field_0x30 = 2;
  *(undefined4 *)&in_RDI->field_0x50 = 4000000;
  this_00 = (OutputWorker *)local_2f0;
  tonk::SDKSocket::Create((SDKSocket *)buffer._40_8_);
  bVar1 = tonk::SDKResult::operator_cast_to_bool((SDKResult *)0x108b23);
  if (!bVar1) {
    tonk::SDKJsonResult::ToString_abi_cxx11_
              ((SDKJsonResult *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
    local_2b0 = &Logger;
    local_2f0._56_8_ = "Unable to create socket: ";
    local_2f0._48_8_ = local_320;
    local_290 = &Logger;
    local_294 = 4;
    local_2a0 = "Unable to create socket: ";
    local_280 = &Logger;
    local_284 = 4;
    local_2a8 = local_2f0._48_8_;
    if ((int)Logger.ChannelMinLevel < 5) {
      local_c8 = &Logger;
      local_cc = 4;
      local_d8 = "Unable to create socket: ";
      local_e0 = (__pthread_internal_list *)local_2f0._48_8_;
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_fffffffffffffc90,
                 (char *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),Trace);
      local_b0 = 0x129358;
      local_a0 = &Logger;
      local_a8 = local_268;
      local_b8 = local_d8;
      local_c0 = local_e0;
      local_88 = &Logger;
      local_98 = local_b0;
      local_90 = local_a8;
      local_80 = local_b0;
      local_78 = local_a8;
      std::operator<<(aoStack_258,(string *)&Logger.Prefix);
      local_58 = &Logger;
      local_60 = local_a8;
      local_68 = local_b8;
      local_70 = local_c0;
      local_40 = &Logger;
      local_48 = local_a8;
      local_50 = local_b8;
      local_30 = local_a8;
      local_38 = local_b8;
      std::operator<<((ostream *)(local_a8 + 0x10),local_b8);
      local_18 = &Logger;
      local_20 = local_60;
      local_28 = local_70;
      local_8 = local_60;
      local_10 = local_70;
      std::operator<<((ostream *)(local_60 + 0x10),(string *)local_70);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(this_00,in_RDI);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x108e8a);
    }
    std::__cxx11::string::~string((string *)local_320);
  }
  bVar2 = tonk::SDKResult::operator_cast_to_bool((SDKResult *)0x108eed);
  tonk::SDKJsonResult::~SDKJsonResult((SDKJsonResult *)0x108f00);
  return (bool)(bVar2 & 1);
}

Assistant:

bool MyServer::Initialize()
{
    // Set configuration
    Config.UDPListenPort = kUDPServerPort_Server;
    Config.MaximumClients = 10;
    Config.Flags = TONK_FLAGS_ENABLE_UPNP;
    Config.Flags |= TONK_FLAGS_DISABLE_COMPRESSION;
    Config.MinuteFloodThresh = 2;
    Config.BandwidthLimitBPS = 4000000;
    //Config.InterfaceAddress = "127.0.0.1";

    tonk::SDKJsonResult result = Create();
    if (!result) {
        Logger.Error("Unable to create socket: ", result.ToString());
    }

    return result;
}